

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void saveToFile(string *str,string *filename)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ostream local_218 [8];
  ofstream out;
  string *filename_local;
  string *str_local;
  
  std::operator+(&local_238,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/",
                 filename);
  std::ofstream::ofstream(local_218,&local_238,0x10);
  std::__cxx11::string::~string((string *)&local_238);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    __assert_fail("out.is_open()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/main.cpp"
                  ,0x111,"void saveToFile(const std::string &, const std::string &)");
  }
  std::operator<<(local_218,(string *)str);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void saveToFile(const std::string& str, const std::string& filename){
    std::ofstream out(SRC"/" +filename);
    assert(out.is_open());
    out << str;
}